

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

NumberParseMatcher * __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::nextCodePointMatcher
          (CodePointMatcherWarehouse *this,UChar32 cp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CodePointMatcher *pCVar4;
  long lVar5;
  undefined8 *puVar6;
  CodePointMatcher **__dest;
  int iVar7;
  undefined4 in_register_00000034;
  uint uVar8;
  CodePointMatcher *pCVar9;
  NumberParseMatcher local_40;
  UChar32 local_38;
  
  iVar7 = this->codePointCount;
  lVar5 = (long)iVar7;
  if (lVar5 < 5) {
    this->codePointCount = iVar7 + 1;
    pCVar9 = (this->codePoints)._M_elems + lVar5;
    (this->codePoints)._M_elems[lVar5].fCp = cp;
  }
  else {
    if (this->codePointNumBatches * 10 + 5 <= iVar7) {
      puVar6 = (undefined8 *)
               UMemory::operator_new__((UMemory *)0xa8,CONCAT44(in_register_00000034,cp));
      if (puVar6 == (undefined8 *)0x0) {
        pCVar9 = (CodePointMatcher *)0x0;
      }
      else {
        *puVar6 = 10;
        lVar5 = 8;
        do {
          *(undefined ***)((long)puVar6 + lVar5) = &PTR__NumberParseMatcher_003ebdf0;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0xa8);
        pCVar9 = (CodePointMatcher *)(puVar6 + 1);
      }
      uVar2 = this->codePointNumBatches;
      if (((this->codePointsOverflow).capacity <= (int)uVar2) && (0 < (int)uVar2)) {
        uVar1 = uVar2 * 2;
        __dest = (CodePointMatcher **)uprv_malloc_63((ulong)uVar1 << 3);
        if (__dest != (CodePointMatcher **)0x0) {
          uVar3 = (this->codePointsOverflow).capacity;
          uVar8 = uVar2;
          if ((int)uVar3 < (int)uVar2) {
            uVar8 = uVar3;
          }
          if (SBORROW4(uVar8,uVar1) == (int)(uVar8 + uVar2 * -2) < 0) {
            uVar8 = uVar1;
          }
          memcpy(__dest,(this->codePointsOverflow).ptr,(long)(int)uVar8 << 3);
          if ((this->codePointsOverflow).needToRelease != '\0') {
            uprv_free_63((this->codePointsOverflow).ptr);
          }
          (this->codePointsOverflow).ptr = __dest;
          (this->codePointsOverflow).capacity = uVar1;
          (this->codePointsOverflow).needToRelease = '\x01';
        }
      }
      iVar7 = this->codePointNumBatches;
      this->codePointNumBatches = iVar7 + 1;
      (this->codePointsOverflow).ptr[iVar7] = pCVar9;
    }
    pCVar4 = (this->codePointsOverflow).ptr[(long)this->codePointNumBatches + -1];
    iVar7 = this->codePointCount;
    this->codePointCount = iVar7 + 1;
    iVar7 = iVar7 + ((iVar7 + -5) / 10) * -10 + -5;
    pCVar9 = pCVar4 + iVar7;
    pCVar4[iVar7].fCp = cp;
  }
  local_40._vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003ebdf0;
  local_38 = cp;
  NumberParseMatcher::~NumberParseMatcher(&local_40);
  return &pCVar9->super_NumberParseMatcher;
}

Assistant:

NumberParseMatcher& CodePointMatcherWarehouse::nextCodePointMatcher(UChar32 cp) {
    if (codePointCount < CODE_POINT_STACK_CAPACITY) {
        return codePoints[codePointCount++] = {cp};
    }
    int32_t totalCapacity = CODE_POINT_STACK_CAPACITY + codePointNumBatches * CODE_POINT_BATCH_SIZE;
    if (codePointCount >= totalCapacity) {
        // Need a new batch
        auto* nextBatch = new CodePointMatcher[CODE_POINT_BATCH_SIZE];
        if (codePointNumBatches >= codePointsOverflow.getCapacity()) {
            // Need more room for storing pointers to batches
            codePointsOverflow.resize(codePointNumBatches * 2, codePointNumBatches);
        }
        codePointsOverflow[codePointNumBatches++] = nextBatch;
    }
    return codePointsOverflow[codePointNumBatches - 1][(codePointCount++ - CODE_POINT_STACK_CAPACITY) %
                                                       CODE_POINT_BATCH_SIZE] = {cp};
}